

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>::
expand(DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>
       *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  Entry *res;
  Entry *pEVar9;
  Exception *this_00;
  Entry *pEVar10;
  ulong uVar11;
  void **head;
  long lVar12;
  Occurrences val;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar12 = (long)iVar1;
  if (lVar12 == 0) {
    pEVar9 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    uVar11 = lVar12 << 5;
    if (uVar11 < 0x21) {
      pEVar9 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar11 < 0x31) {
      pEVar9 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar11 < 0x41) {
      pEVar9 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                  ((FixedSizeAllocator<64UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pEVar9 = (Entry *)::operator_new(uVar11,0x10);
    }
  }
  pEVar5 = this->_entries;
  pEVar6 = this->_afterLast;
  uVar2 = this->_timestamp;
  iVar3 = this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar4 = this->_capacityIndex;
  this->_capacityIndex = iVar4 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar4 * 4 + 4);
  pEVar10 = pEVar9;
  if (iVar1 != 0) {
    do {
      (pEVar10->field_0)._infoData = 0;
      (pEVar10->_val)._occurrences = (List<Shell::NewCNF::Occurrence> *)0x0;
      (pEVar10->_val)._size = 0;
      lVar12 = lVar12 + -1;
      pEVar10 = pEVar10 + 1;
    } while (lVar12 != 0);
  }
  this->_entries = pEVar9;
  this->_afterLast = pEVar9 + this->_capacity;
  for (pEVar9 = pEVar5; pEVar9 != pEVar6; pEVar9 = pEVar9 + 1) {
    if (((pEVar9->field_0)._infoData & 1U) == 0 && (uint)(pEVar9->field_0)._infoData >> 2 == uVar2)
    {
      uVar7 = (pEVar9->_val)._occurrences;
      uVar8 = (pEVar9->_val)._size;
      val._size = uVar8;
      val._occurrences = (List<Shell::NewCNF::Occurrence> *)uVar7;
      val._12_4_ = 0;
      insert(this,pEVar9->_key,val);
    }
  }
  if ((iVar3 != 0) && (pEVar5 != (Entry *)0x0)) {
    uVar11 = (long)iVar3 * 0x20;
    if (uVar11 < 0x21) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar5;
    }
    else if (uVar11 < 0x31) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar5;
    }
    else {
      if (0x40 < uVar11) {
        operator_delete(pEVar5,0x10);
        return;
      }
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar5;
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }